

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Totals * __thiscall Catch::Runner2::runTests(Totals *__return_storage_ptr__,Runner2 *this)

{
  bool bVar1;
  IReporter *pIVar2;
  pointer pTVar3;
  reference filterGroup_00;
  byte local_329;
  string local_308;
  Totals local_2e8;
  string local_2c8;
  __normal_iterator<Catch::TestCaseFilters_*,_std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>_>
  local_2a8;
  __normal_iterator<const_Catch::TestCaseFilters_*,_std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>_>
  local_2a0;
  const_iterator itEnd;
  __normal_iterator<const_Catch::TestCaseFilters_*,_std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>_>
  local_290;
  const_iterator it;
  Runner context;
  allocator<char> local_b1;
  string local_b0;
  undefined1 local_90 [8];
  TestCaseFilters filterGroup;
  vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> filterGroups;
  Runner2 *this_local;
  
  std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::vector
            ((vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> *)
             ((long)&filterGroup.m_name.field_2 + 8),&this->m_config->filters);
  bVar1 = std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::empty
                    ((vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> *)
                     ((long)&filterGroup.m_name.field_2 + 8));
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"",&local_b1);
    TestCaseFilters::TestCaseFilters((TestCaseFilters *)local_90,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::push_back
              ((vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> *)
               ((long)&filterGroup.m_name.field_2 + 8),(value_type *)local_90);
    TestCaseFilters::~TestCaseFilters((TestCaseFilters *)local_90);
  }
  Runner::Runner((Runner *)&it,this->m_configWrapper,&this->m_reporter);
  Totals::Totals(__return_storage_ptr__);
  itEnd._M_current =
       (TestCaseFilters *)
       std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::begin
                 ((vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> *)
                  ((long)&filterGroup.m_name.field_2 + 8));
  __gnu_cxx::
  __normal_iterator<Catch::TestCaseFilters_const*,std::vector<Catch::TestCaseFilters,std::allocator<Catch::TestCaseFilters>>>
  ::__normal_iterator<Catch::TestCaseFilters*>
            ((__normal_iterator<Catch::TestCaseFilters_const*,std::vector<Catch::TestCaseFilters,std::allocator<Catch::TestCaseFilters>>>
              *)&local_290,
             (__normal_iterator<Catch::TestCaseFilters_*,_std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>_>
              *)&itEnd);
  local_2a8._M_current =
       (TestCaseFilters *)
       std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::end
                 ((vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> *)
                  ((long)&filterGroup.m_name.field_2 + 8));
  __gnu_cxx::
  __normal_iterator<Catch::TestCaseFilters_const*,std::vector<Catch::TestCaseFilters,std::allocator<Catch::TestCaseFilters>>>
  ::__normal_iterator<Catch::TestCaseFilters*>
            ((__normal_iterator<Catch::TestCaseFilters_const*,std::vector<Catch::TestCaseFilters,std::allocator<Catch::TestCaseFilters>>>
              *)&local_2a0,&local_2a8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_290,&local_2a0);
    local_329 = 0;
    if (bVar1) {
      bVar1 = Runner::aborting((Runner *)&it);
      local_329 = bVar1 ^ 0xff;
    }
    if ((local_329 & 1) == 0) break;
    pIVar2 = Ptr<Catch::IReporter>::operator->(&this->m_reporter);
    pTVar3 = __gnu_cxx::
             __normal_iterator<const_Catch::TestCaseFilters_*,_std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>_>
             ::operator->(&local_290);
    TestCaseFilters::getName_abi_cxx11_(&local_2c8,pTVar3);
    (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[7])(pIVar2,&local_2c8);
    std::__cxx11::string::~string((string *)&local_2c8);
    filterGroup_00 =
         __gnu_cxx::
         __normal_iterator<const_Catch::TestCaseFilters_*,_std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>_>
         ::operator*(&local_290);
    runTestsForGroup(&local_2e8,this,(Runner *)&it,filterGroup_00);
    Totals::operator+=(__return_storage_ptr__,&local_2e8);
    bVar1 = Runner::aborting((Runner *)&it);
    if (bVar1) {
      pIVar2 = Ptr<Catch::IReporter>::operator->(&this->m_reporter);
      (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xf])();
    }
    pIVar2 = Ptr<Catch::IReporter>::operator->(&this->m_reporter);
    pTVar3 = __gnu_cxx::
             __normal_iterator<const_Catch::TestCaseFilters_*,_std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>_>
             ::operator->(&local_290);
    TestCaseFilters::getName_abi_cxx11_(&local_308,pTVar3);
    (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[8])
              (pIVar2,&local_308,__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_308);
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCaseFilters_*,_std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>_>
    ::operator++(&local_290);
  }
  Runner::~Runner((Runner *)&it);
  std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::~vector
            ((vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> *)
             ((long)&filterGroup.m_name.field_2 + 8));
  return __return_storage_ptr__;
}

Assistant:

Totals runTests() {

            std::vector<TestCaseFilters> filterGroups = m_config.filters;
            if( filterGroups.empty() ) {
                TestCaseFilters filterGroup( "" );
                filterGroups.push_back( filterGroup );
            }

            Runner context( m_configWrapper, m_reporter ); // This Runner will be renamed Context
            Totals totals;

            std::vector<TestCaseFilters>::const_iterator it = filterGroups.begin();
            std::vector<TestCaseFilters>::const_iterator itEnd = filterGroups.end();
            for(; it != itEnd && !context.aborting(); ++it ) {
                m_reporter->StartGroup( it->getName() );
                totals += runTestsForGroup( context, *it );
                if( context.aborting() )
                    m_reporter->Aborted();
                m_reporter->EndGroup( it->getName(), totals );
            }
            return totals;
        }